

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O0

ssize_t __thiscall
pstore::romfs::descriptor::read(descriptor *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *this_00;
  ssize_t sVar1;
  size_t count_local;
  size_t size_local;
  descriptor *this_local;
  not_null<void_*> buffer_local;
  
  this_00 = std::
            __shared_ptr_access<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  sVar1 = open_file::read(this_00,__fd,__buf,__nbytes);
  return sVar1;
}

Assistant:

std::size_t descriptor::read (not_null<void *> const buffer, std::size_t const size,
                                      std::size_t const count) {
            return f_->read (buffer, size, count);
        }